

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferOperations.cpp
# Opt level: O0

string * __thiscall
glcts::TextureBufferOperations::getFragmentShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TextureBufferOperations *this)

{
  stringstream local_1a0 [8];
  stringstream strstream;
  ostream local_190;
  TextureBufferOperations *local_18;
  TextureBufferOperations *this_local;
  
  local_18 = this;
  this_local = (TextureBufferOperations *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(&local_190,
                  "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\nprecision highp float;\n\nin float fs_index;\n\nlayout(location = 0) out ivec4 color;\n\nuniform highp isamplerBuffer sampler_buffer;\n\nvoid main(void)\n{\n    color = texelFetch( sampler_buffer, int(fs_index) );\n }\n"
                 );
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureBufferOperations::getFragmentShaderCode() const
{
	std::stringstream strstream;

	strstream << "${VERSION}\n"
				 "\n"
				 "${TEXTURE_BUFFER_REQUIRE}\n"
				 "\n"
				 "precision highp float;\n"
				 "\n"
				 "in float fs_index;\n"
				 "\n"
				 "layout(location = 0) out ivec4 color;\n"
				 "\n"
				 "uniform highp isamplerBuffer sampler_buffer;\n"
				 "\n"
				 "void main(void)\n"
				 "{\n"
				 "    color = texelFetch( sampler_buffer, int(fs_index) );\n "
				 "}\n";

	return strstream.str();
}